

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::analyze_load_instruction(Impl *impl,LoadInst *inst)

{
  undefined4 uVar1;
  undefined8 uVar2;
  GlobalVariable *pGVar3;
  undefined8 uVar4;
  ValueKind VVar5;
  uint uVar6;
  Value *pVVar7;
  ConstantExpr *pCVar8;
  Type *this;
  iterator iVar9;
  Constant *pCVar10;
  mapped_type *pmVar11;
  LoggingCallback p_Var12;
  void *pvVar13;
  AllocaTrackedIndex tracked;
  char buffer [4096];
  undefined1 local_1065;
  undefined3 uStack_1064;
  AllocaTrackedIndex local_1058;
  ConstantExpr *local_1038;
  undefined5 uStack_1030;
  undefined3 uStack_102b;
  undefined5 local_1028;
  undefined3 uStack_1023;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  char local_1018 [4072];
  
  pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
  gep_pointer_to_alloca_tracked_inst(&local_1058,impl,pVVar7);
  if (local_1058.cbv_handle != (Value *)0x0) {
    *(undefined1 *)
     ((long)local_1058.itr.
            super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
            ._M_cur + 0x28) = 1;
    pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
    pCVar8 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(pVVar7);
    VVar5 = LLVMBC::Value::get_value_kind((Value *)pCVar8);
    if (VVar5 != GetElementPtr) {
      p_Var12 = get_thread_log_callback();
      if (p_Var12 == (LoggingCallback)0x0) {
        analyze_load_instruction();
        std::terminate();
      }
      local_1028 = 0x6163206e69;
      uStack_1023 = 0x3c7473;
      uStack_1020 = 0xa2e3e54;
      local_1038 = (ConstantExpr *)0x2064696c61766e49;
      uStack_1030 = 0x2065707974;
      uStack_102b = 0x204449;
      pvVar13 = get_thread_log_callback_userdata();
      (*p_Var12)(pvVar13,Error,(char *)&local_1038);
      std::terminate();
    }
    local_1038 = pCVar8;
    std::
    _Hashtable<const_LLVMBC::GetElementPtrInst_*,_const_LLVMBC::GetElementPtrInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(impl->masked_alloca_forward_gep)._M_h);
  }
  pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
  this = LLVMBC::Value::getType(pVVar7);
  uVar6 = LLVMBC::Type::getPointerAddressSpace(this);
  if ((char)uVar6 == '\x03') {
    (impl->shader_analysis).has_group_shared_access = true;
  }
  pVVar7 = LLVMBC::LoadInst::getPointerOperand(inst);
  if (pVVar7 != (Value *)0x0) {
    pCVar8 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(pVVar7);
    VVar5 = LLVMBC::Value::get_value_kind((Value *)pCVar8);
    if ((VVar5 == ConstantExpr) && (uVar6 = LLVMBC::ConstantExpr::getOpcode(pCVar8), uVar6 == 200))
    {
      local_1038 = (ConstantExpr *)LLVMBC::ConstantExpr::getOperand(pCVar8,0);
      iVar9 = std::
              _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)&local_1038)
      ;
      if (iVar9.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
          ._M_cur != (__node_type *)0x0) {
        pCVar10 = LLVMBC::ConstantExpr::getOperand(pCVar8,1);
        pVVar7 = LLVMBC::Internal::resolve_proxy(&pCVar10->super_Value);
        VVar5 = LLVMBC::Value::get_value_kind(pVVar7);
        if (VVar5 == ConstantInt) {
          uVar6 = LLVMBC::ConstantExpr::getNumOperands(pCVar8);
          if (uVar6 == 3) {
            uVar2 = *(undefined8 *)
                     ((long)iVar9.
                            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                            ._M_cur + 0x10);
            pGVar3 = *(GlobalVariable **)
                      ((long)iVar9.
                             super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                             ._M_cur + 0x20);
            uStack_1064 = (undefined3)
                          ((uint)*(undefined4 *)
                                  ((long)iVar9.
                                         super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                         ._M_cur + 0x2c) >> 8);
            uVar1 = *(undefined4 *)
                     ((long)iVar9.
                            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                            ._M_cur + 0x29);
            pCVar10 = LLVMBC::ConstantExpr::getOperand(pCVar8,2);
            local_1038 = pCVar8;
            pmVar11 = std::__detail::
                      _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&impl->llvm_global_variable_to_resource_mapping,
                                   (key_type *)&local_1038);
            pmVar11->type = (char)uVar2;
            *(int3 *)&pmVar11->field_0x1 = (int3)((ulong)uVar2 >> 8);
            pmVar11->meta_index = (int)((ulong)uVar2 >> 0x20);
            pmVar11->offset = &pCVar10->super_Value;
            pmVar11->variable = pGVar3;
            pmVar11->non_uniform = false;
            local_1065 = (undefined1)((uint)uVar1 >> 0x18);
            *(undefined4 *)&pmVar11->field_0x19 = uVar1;
            *(uint *)&pmVar11->field_0x1c = CONCAT31(uStack_1064,local_1065);
            goto LAB_001569d7;
          }
          p_Var12 = get_thread_log_callback();
          if (p_Var12 == (LoggingCallback)0x0) {
            analyze_load_instruction();
            return false;
          }
          memcpy(&local_1038,
                 "Number of operands to getelementptr for a resource handle is unexpected.\n",0x4a);
        }
        else {
          p_Var12 = get_thread_log_callback();
          if (p_Var12 == (LoggingCallback)0x0) {
            analyze_load_instruction();
            return false;
          }
          builtin_strncpy(local_1018,"ot constant 0.\n",0x10);
          local_1028 = 0x6f20727450;
          uStack_1023 = 0x726570;
          uStack_1020 = 0x6920646e61;
          uStack_101b = 0x6e2073;
          local_1038 = (ConstantExpr *)0x6547207473726946;
          uStack_1030 = 0x6d656c4574;
          uStack_102b = 0x746e65;
        }
        pvVar13 = get_thread_log_callback_userdata();
        (*p_Var12)(pvVar13,Error,(char *)&local_1038);
        return false;
      }
    }
  }
LAB_001569d7:
  local_1038 = (ConstantExpr *)LLVMBC::LoadInst::getPointerOperand(inst);
  iVar9 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)&local_1038);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_1038 = (ConstantExpr *)inst;
    pmVar11 = std::__detail::
              _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->llvm_global_variable_to_resource_mapping,
                           (key_type *)&local_1038);
    uVar2 = *(undefined8 *)
             ((long)iVar9.
                    super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                    ._M_cur + 0x10);
    pVVar7 = *(Value **)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                     ._M_cur + 0x18);
    pGVar3 = *(GlobalVariable **)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                     ._M_cur + 0x20);
    uVar4 = *(undefined8 *)
             ((long)iVar9.
                    super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                    ._M_cur + 0x28);
    pmVar11->type = (char)uVar2;
    *(int3 *)&pmVar11->field_0x1 = (int3)((ulong)uVar2 >> 8);
    pmVar11->meta_index = (int)((ulong)uVar2 >> 0x20);
    pmVar11->offset = pVVar7;
    pmVar11->variable = pGVar3;
    *(undefined8 *)&pmVar11->non_uniform = uVar4;
  }
  return true;
}

Assistant:

bool analyze_load_instruction(Converter::Impl &impl, const llvm::LoadInst *inst)
{
	auto tracked = gep_pointer_to_alloca_tracked_inst(impl, inst->getPointerOperand());
	if (tracked.cbv_handle)
	{
		tracked.itr->second.has_load = true;
		// We'll need this GEP after all.
		impl.masked_alloca_forward_gep.erase(llvm::cast<llvm::GetElementPtrInst>(inst->getPointerOperand()));
	}

	if (DXIL::AddressSpace(inst->getPointerOperand()->getType()->getPointerAddressSpace()) == DXIL::AddressSpace::GroupShared)
		impl.shader_analysis.has_group_shared_access = true;

	if (auto *const_expr = llvm::dyn_cast<llvm::ConstantExpr>(inst->getPointerOperand()))
	{
		if (const_expr->getOpcode() == llvm::Instruction::GetElementPtr)
		{
			auto *ptr = const_expr->getOperand(0);
			auto itr = impl.llvm_global_variable_to_resource_mapping.find(ptr);
			if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
			    !emit_getelementptr_resource(impl, const_expr, itr->second))
			{
				return false;
			}
		}
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getPointerOperand());
	if (itr != impl.llvm_global_variable_to_resource_mapping.end())
		impl.llvm_global_variable_to_resource_mapping[inst] = itr->second;

	return true;
}